

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::clear(mipmapped_texture *this)

{
  dynamic_string *in_RDI;
  mipmapped_texture *unaff_retaddr;
  
  free_all_mips(unaff_retaddr);
  dynamic_string::clear(in_RDI);
  in_RDI[1].m_buf_size = 0;
  in_RDI[1].m_len = 0;
  *(undefined4 *)&in_RDI[1].field_0x4 = 0;
  *(undefined4 *)&in_RDI[1].m_pStr = 0xf;
  *(undefined4 *)((long)&in_RDI[1].m_pStr + 4) = 0;
  in_RDI[3].m_buf_size = 0xffff;
  in_RDI[3].m_len = 0xffff;
  dynamic_string::clear(in_RDI);
  return;
}

Assistant:

void mipmapped_texture::clear() {
  free_all_mips();

  m_name.clear();
  m_width = 0;
  m_height = 0;
  m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  m_format = PIXEL_FMT_INVALID;
  m_source_file_type = texture_file_types::cFormatInvalid;
  m_last_error.clear();
}